

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

NewOrderSingle * __thiscall
Application::queryNewOrderSingle42(NewOrderSingle *__return_storage_ptr__,Application *this)

{
  char cVar1;
  OrdType *aOrdType;
  Header *header;
  StopPx local_400;
  Price local_3a8;
  TimeInForce local_350;
  OrderQty local_2f8;
  OrdType local_2a0;
  TransactTime local_248;
  Side local_1f0;
  Symbol local_198;
  CHAR local_139;
  HandlInst local_138;
  ClOrdID local_d0;
  undefined1 local_71;
  undefined1 local_70 [8];
  OrdType ordType;
  Application *this_local;
  NewOrderSingle *newOrderSingle;
  
  ordType.super_CharField.super_FieldBase.m_metrics = (field_metrics)this;
  FIX::OrdType::OrdType((OrdType *)local_70);
  local_71 = 0;
  queryClOrdID(&local_d0,this);
  local_139 = '1';
  FIX::HandlInst::HandlInst(&local_138,&local_139);
  querySymbol(&local_198,this);
  querySide(&local_1f0,this);
  FIX::TransactTime::TransactTime(&local_248);
  queryOrdType(&local_2a0,this);
  aOrdType = FIX::OrdType::operator=((OrdType *)local_70,&local_2a0);
  FIX42::NewOrderSingle::NewOrderSingle
            (__return_storage_ptr__,&local_d0,&local_138,&local_198,&local_1f0,&local_248,aOrdType);
  FIX::OrdType::~OrdType(&local_2a0);
  FIX::TransactTime::~TransactTime(&local_248);
  FIX::Side::~Side(&local_1f0);
  FIX::Symbol::~Symbol(&local_198);
  FIX::HandlInst::~HandlInst(&local_138);
  FIX::ClOrdID::~ClOrdID(&local_d0);
  queryOrderQty(&local_2f8,this);
  FIX42::NewOrderSingle::set(__return_storage_ptr__,&local_2f8);
  FIX::OrderQty::~OrderQty(&local_2f8);
  queryTimeInForce(&local_350,this);
  FIX42::NewOrderSingle::set(__return_storage_ptr__,&local_350);
  FIX::TimeInForce::~TimeInForce(&local_350);
  cVar1 = FIX::CharField::operator_cast_to_char((CharField *)local_70);
  if ((cVar1 == '2') ||
     (cVar1 = FIX::CharField::operator_cast_to_char((CharField *)local_70), cVar1 == '4')) {
    queryPrice(&local_3a8,this);
    FIX42::NewOrderSingle::set(__return_storage_ptr__,&local_3a8);
    FIX::Price::~Price(&local_3a8);
  }
  cVar1 = FIX::CharField::operator_cast_to_char((CharField *)local_70);
  if ((cVar1 == '3') ||
     (cVar1 = FIX::CharField::operator_cast_to_char((CharField *)local_70), cVar1 == '4')) {
    queryStopPx(&local_400,this);
    FIX42::NewOrderSingle::set(__return_storage_ptr__,&local_400);
    FIX::StopPx::~StopPx(&local_400);
  }
  header = FIX42::Message::getHeader(&__return_storage_ptr__->super_Message);
  queryHeader(this,(Header *)header);
  local_71 = 1;
  FIX::OrdType::~OrdType((OrdType *)local_70);
  return __return_storage_ptr__;
}

Assistant:

FIX42::NewOrderSingle Application::queryNewOrderSingle42() {
  FIX::OrdType ordType;

  FIX42::NewOrderSingle newOrderSingle(
      queryClOrdID(),
      FIX::HandlInst('1'),
      querySymbol(),
      querySide(),
      FIX::TransactTime(),
      ordType = queryOrdType());

  newOrderSingle.set(queryOrderQty());
  newOrderSingle.set(queryTimeInForce());
  if (ordType == FIX::OrdType_LIMIT || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryPrice());
  }
  if (ordType == FIX::OrdType_STOP || ordType == FIX::OrdType_STOP_LIMIT) {
    newOrderSingle.set(queryStopPx());
  }

  queryHeader(newOrderSingle.getHeader());
  return newOrderSingle;
}